

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O0

int inplace_feedback_left_proc(Am_Object *self)

{
  byte bVar1;
  int iVar2;
  Am_Value *this;
  Am_Object local_40;
  int local_34;
  int local_30;
  int y;
  int x;
  Am_Object local_20;
  Am_Object operates_on;
  Am_Object *self_local;
  
  operates_on.data = (Am_Object_Data *)self;
  Am_Object::Get_Object((ushort)&local_20,(ulong)self);
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) == 0) {
    self_local._4_4_ = 0;
  }
  else {
    Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)operates_on.data);
    Am_Translate_Coordinates((Am_Object *)&local_20,0,0,(Am_Object *)&local_40,&local_30,&local_34);
    Am_Object::~Am_Object(&local_40);
    this = (Am_Value *)Am_Object::Get((ushort)operates_on.data,(ulong)Am_TEXT_X_OFFSET);
    iVar2 = Am_Value::operator_cast_to_int(this);
    self_local._4_4_ = local_30 + iVar2;
  }
  Am_Object::~Am_Object(&local_20);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, inplace_feedback_left)
{
  Am_Object operates_on = self.Get_Object(Am_OPERATES_ON);
  if (operates_on.Valid()) {
    int x, y;
    Am_Translate_Coordinates(operates_on, 0, 0, self.Get_Owner(), x, y);
    return x + (int)self.Get(Am_TEXT_X_OFFSET);
  }
  return 0;
}